

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

int sexp_write_utf8_char(sexp ctx,int c,sexp out)

{
  byte *__s;
  sexp psVar1;
  sexp psVar2;
  byte in_AL;
  int iVar3;
  size_t len;
  uint len_00;
  uchar buf [8];
  byte local_28 [8];
  
  len_00 = 1;
  if ((0x7f < c) && (len_00 = 2, 0x7ff < (uint)c)) {
    len_00 = 4 - ((uint)c < 0x10000);
  }
  local_28[0] = in_AL;
  sexp_utf8_encode_char(local_28,len_00,c);
  local_28[len_00] = 0;
  psVar1 = (out->value).type.setters;
  if (psVar1 == (sexp)0x0) {
    iVar3 = putc((uint)local_28[0],(FILE *)(out->value).type.getters);
  }
  else {
    psVar2 = (out->value).type.print;
    if (psVar2 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
      *(byte *)((long)&psVar2->tag + (long)&psVar1->tag) = local_28[0];
      goto LAB_00113acc;
    }
    iVar3 = sexp_buffered_write_char(ctx,(uint)local_28[0],out);
  }
  if (iVar3 == -1) {
    return -1;
  }
LAB_00113acc:
  __s = local_28 + 1;
  if ((out->value).type.setters == (sexp)0x0) {
    fputs((char *)__s,(FILE *)(out->value).type.getters);
  }
  else {
    len = strlen((char *)__s);
    sexp_buffered_write_string_n(ctx,(char *)__s,len,out);
  }
  return len_00;
}

Assistant:

int sexp_write_utf8_char (sexp ctx, int c, sexp out) {
  unsigned char buf[8];
  int len = sexp_utf8_char_byte_count(c), i;
  sexp_utf8_encode_char(buf, len, c);
  buf[len] = 0;
  i = sexp_write_char(ctx, buf[0], out);
  if (i == EOF) return EOF;
  sexp_write_string(ctx, (char*)buf+1, out);
  return len;
}